

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_lib.cc
# Opt level: O0

bool bssl::tls_new(SSL *ssl)

{
  bool bVar1;
  int iVar2;
  pointer pSVar3;
  unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> local_50;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_48;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_40 [3];
  undefined4 local_24;
  unique_ptr<bssl::SSL3_STATE,_bssl::internal::Deleter> local_20;
  UniquePtr<SSL3_STATE> s3;
  SSL *ssl_local;
  
  s3._M_t.super___uniq_ptr_impl<bssl::SSL3_STATE,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::SSL3_STATE_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSL3_STATE_*,_false>._M_head_impl =
       (__uniq_ptr_data<bssl::SSL3_STATE,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bssl::SSL3_STATE,_bssl::internal::Deleter,_true,_true>)ssl;
  MakeUnique<bssl::SSL3_STATE>();
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (!bVar1) {
    ssl_local._7_1_ = false;
    goto LAB_00193b62;
  }
  iVar2 = SSL_is_dtls((SSL *)s3._M_t.
                             super___uniq_ptr_impl<bssl::SSL3_STATE,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bssl::SSL3_STATE_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bssl::SSL3_STATE_*,_false>._M_head_impl);
  if (iVar2 == 0) {
    SSLAEADContext::CreateNullCipher();
    pSVar3 = std::unique_ptr<bssl::SSL3_STATE,_bssl::internal::Deleter>::operator->(&local_20);
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator=
              (&pSVar3->aead_read_ctx,local_40);
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(local_40);
    SSLAEADContext::CreateNullCipher();
    pSVar3 = std::unique_ptr<bssl::SSL3_STATE,_bssl::internal::Deleter>::operator->(&local_20);
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator=
              (&pSVar3->aead_write_ctx,&local_48);
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_48);
    pSVar3 = std::unique_ptr<bssl::SSL3_STATE,_bssl::internal::Deleter>::operator->(&local_20);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pSVar3->aead_read_ctx);
    if (bVar1) {
      pSVar3 = std::unique_ptr<bssl::SSL3_STATE,_bssl::internal::Deleter>::operator->(&local_20);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pSVar3->aead_write_ctx);
      if (bVar1) goto LAB_00193ae6;
    }
    ssl_local._7_1_ = false;
  }
  else {
LAB_00193ae6:
    ssl_handshake_new((bssl *)&local_50,
                      (SSL *)s3._M_t.
                             super___uniq_ptr_impl<bssl::SSL3_STATE,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bssl::SSL3_STATE_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bssl::SSL3_STATE_*,_false>._M_head_impl);
    pSVar3 = std::unique_ptr<bssl::SSL3_STATE,_bssl::internal::Deleter>::operator->(&local_20);
    std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator=(&pSVar3->hs,&local_50);
    std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::~unique_ptr(&local_50);
    pSVar3 = std::unique_ptr<bssl::SSL3_STATE,_bssl::internal::Deleter>::operator->(&local_20);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pSVar3->hs);
    if (bVar1) {
      pSVar3 = std::unique_ptr<bssl::SSL3_STATE,_bssl::internal::Deleter>::release(&local_20);
      *(pointer *)
       ((long)s3._M_t.super___uniq_ptr_impl<bssl::SSL3_STATE,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bssl::SSL3_STATE_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bssl::SSL3_STATE_*,_false>._M_head_impl + 0x30) = pSVar3;
      ssl_local._7_1_ = true;
    }
    else {
      ssl_local._7_1_ = false;
    }
  }
LAB_00193b62:
  local_24 = 1;
  std::unique_ptr<bssl::SSL3_STATE,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return ssl_local._7_1_;
}

Assistant:

bool tls_new(SSL *ssl) {
  UniquePtr<SSL3_STATE> s3 = MakeUnique<SSL3_STATE>();
  if (!s3) {
    return false;
  }

  // TODO(crbug.com/368805255): Fields that aren't used in DTLS should not be
  // allocated at all.
  // TODO(crbug.com/371998381): Don't create these in QUIC either, once the
  // placeholder QUIC ones for subsequent epochs are removed.
  if (!SSL_is_dtls(ssl)) {
    s3->aead_read_ctx = SSLAEADContext::CreateNullCipher();
    s3->aead_write_ctx = SSLAEADContext::CreateNullCipher();
    if (!s3->aead_read_ctx || !s3->aead_write_ctx) {
      return false;
    }
  }

  s3->hs = ssl_handshake_new(ssl);
  if (!s3->hs) {
    return false;
  }

  ssl->s3 = s3.release();
  return true;
}